

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OMFormat.hh
# Opt level: O1

size_t OpenMesh::IO::restore<OpenMesh::IO::OMFormat::Chunk::PropertyName>
                 (istream *_is,PropertyName *_pn,bool _swap)

{
  size_t sVar1;
  ulong uVar2;
  byte local_158 [8];
  uint8 v;
  string local_50;
  
  std::istream::read((char *)_is,(long)local_158);
  uVar2 = (ulong)local_158[0];
  if (uVar2 != 0) {
    std::istream::read((char *)_is,(long)local_158);
    local_158[uVar2] = 0;
    std::__cxx11::string::resize((ulong)_pn,local_158[0]);
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    sVar1 = strlen((char *)local_158);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,local_158,local_158 + sVar1)
    ;
    OMFormat::Chunk::PropertyName::operator=(_pn,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
  }
  return uVar2 + 1;
}

Assistant:

inline
  size_t restore( std::istream& _is, OMFormat::Chunk::PropertyName& _pn,
		  bool _swap )
  {
    size_t size;

    restore( _is, size, OMFormat::Chunk::Integer_8, _swap); // 1 byte

    assert( OMFormat::Chunk::PropertyName::is_valid( size ) );

    if ( size > 0 )
    {
      char buf[256];
      _is.read( buf, size ); // size bytes
      buf[size] = '\0';
      _pn.resize(size);
      _pn = buf;
    }
    return size+1;
  }